

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

STAmount * jbcoin::multiply(STAmount *__return_storage_ptr__,STAmount *v1,STAmount *v2,Issue *issue)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  int exponent;
  exponent_type eVar8;
  byte bVar9;
  STAmount *amount;
  exponent_type eVar10;
  STAmount SStack_78;
  
  uVar4 = v1->mValue;
  if ((uVar4 == 0) || (uVar5 = v2->mValue, uVar5 == 0)) {
    uVar7 = 0;
    exponent = 0;
    bVar1 = false;
  }
  else {
    bVar9 = v1->mIsNative;
    if (((bool)bVar9 == true) && (v2->mIsNative == true)) {
      STAmount::STAmount(&SStack_78,issue,0,0,false);
      bVar1 = beast::operator==(&SStack_78.mIssue);
      if (bVar1) {
        iVar2 = getSNValue(v1);
        iVar3 = getSNValue(v2);
        amount = v2;
        if (iVar2 < iVar3) {
          amount = v1;
        }
        uVar4 = getSNValue(amount);
        iVar2 = getSNValue(v1);
        iVar3 = getSNValue(v2);
        if (iVar3 <= iVar2) {
          v2 = v1;
        }
        uVar5 = getSNValue(v2);
        if ((uVar4 < 0xb2d05e01) && ((uVar5 >> 0x20) * uVar4 < 0x7ce66c51)) {
          (__return_storage_ptr__->super_STBase).fName = (v1->super_STBase).fName;
          (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002f8010;
          (__return_storage_ptr__->mIssue).currency.pn[0] = 0;
          (__return_storage_ptr__->mIssue).currency.pn[1] = 0;
          (__return_storage_ptr__->mIssue).currency.pn[2] = 0;
          (__return_storage_ptr__->mIssue).currency.pn[3] = 0;
          *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = 0;
          (__return_storage_ptr__->mIssue).account.pn[1] = 0;
          (__return_storage_ptr__->mIssue).account.pn[2] = 0;
          (__return_storage_ptr__->mIssue).account.pn[3] = 0;
          (__return_storage_ptr__->mIssue).account.pn[4] = 0;
          __return_storage_ptr__->mValue = uVar5 * uVar4;
          __return_storage_ptr__->mOffset = 0;
          __return_storage_ptr__->mIsNative = true;
          __return_storage_ptr__->mIsNegative = false;
          return __return_storage_ptr__;
        }
        Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"Native value overflow");
      }
      uVar4 = v1->mValue;
      uVar5 = v2->mValue;
      bVar9 = v1->mIsNative;
    }
    eVar10 = v1->mOffset;
    if ((uVar4 < 1000000000000000) && (uVar6 = uVar4, (bVar9 & 1) != 0)) {
      do {
        uVar4 = uVar6 * 10;
        eVar10 = eVar10 + -1;
        bVar1 = uVar6 < 100000000000000;
        uVar6 = uVar4;
      } while (bVar1);
    }
    eVar8 = v2->mOffset;
    if ((uVar5 < 1000000000000000) && (uVar6 = uVar5, v2->mIsNative != false)) {
      do {
        uVar5 = uVar6 * 10;
        eVar8 = eVar8 + -1;
        bVar1 = uVar6 < 100000000000000;
        uVar6 = uVar5;
      } while (bVar1);
    }
    uVar7 = muldiv(uVar4,uVar5,100000000000000);
    uVar7 = uVar7 + 7;
    exponent = eVar10 + 0xe + eVar8;
    bVar1 = v1->mIsNegative != v2->mIsNegative;
  }
  STAmount::STAmount(__return_storage_ptr__,issue,uVar7,exponent,bVar1);
  return __return_storage_ptr__;
}

Assistant:

STAmount
multiply (STAmount const& v1, STAmount const& v2, Issue const& issue)
{
    if (v1 == zero || v2 == zero)
        return STAmount (issue);

    if (v1.native() && v2.native() && isXRP (issue))
    {
        std::uint64_t const minV = getSNValue (v1) < getSNValue (v2)
                ? getSNValue (v1) : getSNValue (v2);
        std::uint64_t const maxV = getSNValue (v1) < getSNValue (v2)
                ? getSNValue (v2) : getSNValue (v1);

        if (minV > 3000000000ull) // sqrt(cMaxNative)
            Throw<std::runtime_error> ("Native value overflow");

        if (((maxV >> 32) * minV) > 2095475792ull) // cMaxNative / 2^32
            Throw<std::runtime_error> ("Native value overflow");

        return STAmount (v1.getFName (), minV * maxV);
    }

    std::uint64_t value1 = v1.mantissa();
    std::uint64_t value2 = v2.mantissa();
    int offset1 = v1.exponent();
    int offset2 = v2.exponent();

    if (v1.native())
    {
        while (value1 < STAmount::cMinValue)
        {
            value1 *= 10;
            --offset1;
        }
    }

    if (v2.native())
    {
        while (value2 < STAmount::cMinValue)
        {
            value2 *= 10;
            --offset2;
        }
    }

    // We multiply the two mantissas (each is between 10^15
    // and 10^16), so their product is in the 10^30 to 10^32
    // range. Dividing their product by 10^14 maintains the
    // precision, by scaling the result to 10^16 to 10^18.
    return STAmount (issue,
        muldiv(value1, value2, tenTo14) + 7,
        offset1 + offset2 + 14,
        v1.negative() != v2.negative());
}